

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbt2DShape.cpp
# Opt level: O2

cbtVector3 __thiscall
cbt2DsegmentShape::localGetSupportingVertexWithoutMargin(cbt2DsegmentShape *this,cbtVector3 *vec0)

{
  undefined1 *v2;
  cbtVector3 *pcVar1;
  cbtScalar cVar2;
  cbtScalar cVar3;
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [56];
  undefined1 auVar4 [64];
  undefined1 extraout_var [56];
  undefined1 auVar5 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar9 [56];
  undefined1 auVar8 [64];
  cbtVector3 cVar10;
  cbtVector3 local_38;
  undefined1 auVar7 [64];
  
  auVar9 = in_ZMM1._8_56_;
  auVar6 = in_ZMM0._8_56_;
  v2 = &(this->super_cbtConvexInternalShape).field_0x44;
  cVar10 = ::operator-(vec0,(cbtVector3 *)v2);
  auVar7._0_8_ = cVar10.m_floats._8_8_;
  auVar7._8_56_ = auVar9;
  auVar4._0_8_ = cVar10.m_floats._0_8_;
  auVar4._8_56_ = auVar6;
  local_38.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar4._0_16_,auVar7._0_16_);
  cVar2 = cbtVector3::length(&local_38);
  auVar6 = extraout_var;
  cVar10 = ::operator-(vec0,&this->P2);
  auVar8._0_8_ = cVar10.m_floats._8_8_;
  auVar8._8_56_ = auVar9;
  auVar5._0_8_ = cVar10.m_floats._0_8_;
  auVar5._8_56_ = auVar6;
  local_38.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar5._0_16_,auVar8._0_16_);
  cVar3 = cbtVector3::length(&local_38);
  pcVar1 = &this->P2;
  if (cVar2 < cVar3) {
    pcVar1 = (cbtVector3 *)v2;
  }
  cVar10.m_floats._8_8_ = *(undefined8 *)((&this->P2)[(ulong)(cVar3 <= cVar2) - 1].m_floats + 2);
  cVar10.m_floats._0_8_ = *(undefined8 *)pcVar1->m_floats;
  return (cbtVector3)cVar10.m_floats;
}

Assistant:

cbtVector3	cbt2DsegmentShape::localGetSupportingVertexWithoutMargin(const cbtVector3& vec0)const
{
	cbtVector3 supVec(0,0,0);
	
    cbtScalar L1 = (vec0-P1).length();
    cbtScalar L2 = (vec0-P2).length();
    
    if(L1<L2)
        return P1;
       
    return P2;
}